

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

bool_t derTIsValid(u32 tag)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  u32 uVar4;
  
  if (tag == 0) {
    return 0;
  }
  if (tag < 0x100) {
    uVar3 = ~tag & 0x1f;
  }
  else {
    if ((char)tag < '\0') {
      return 0;
    }
    uVar2 = tag & 0x7f;
    uVar4 = tag;
    uVar3 = uVar2;
    if (0xffff < tag) {
      do {
        if (-1 < (short)uVar4) {
          return 0;
        }
        if (0x1ffffff < uVar2) {
          return 0;
        }
        tag = uVar4 >> 8;
        uVar3 = tag & 0x7f;
        uVar2 = uVar2 << 7 | uVar3;
        bVar1 = 0xffffff < uVar4;
        uVar4 = tag;
      } while (bVar1);
    }
    if ((~tag & 0x1f00) != 0) {
      return 0;
    }
    if (uVar2 < 0x1f) {
      return 0;
    }
  }
  if (uVar3 == 0) {
    return 0;
  }
  return 1;
}

Assistant:

static bool_t derTIsValid(u32 tag)
{
	if (tag == 0)
		return FALSE;
	else if (tag < 256)
	{
		// установлены 5 младших битов?
		if ((tag & 31) == 31)
			return FALSE;
	}
	// длинный код
	else
	{
		u32 t;
		u32 b;
		// установлен старший бит в последнем (младшем) октете?
		if (tag & 128)
			return FALSE;
		// пробегаем ненулевые октеты вплоть до первого (старшего)
		for (b = tag & 127, t = b, tag >>= 8; tag > 255; tag >>= 8)
		{
			// в промежуточном октете снят старший бит?
			// будет переполнение при пересчете тега-как-значения?
			if ((tag & 128) == 0 || (t >> 25) != 0)
				return FALSE;
			// пересчитать тег-как-значение
			b = tag & 127, t = t << 7, t |= b;
		}
		// можно кодировать одним октетом? меньшим числом октетов?
		// в первом (старшем) октете не установлены 5 младших битов?
		if (t < 31 || b == 0 || (tag & 31) != 31)
			return FALSE;
	}
	return TRUE;
}